

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O0

void walk(size_t stream_number,QPDFObjectHandle *obj,
         vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *result)

{
  byte bVar1;
  bool bVar2;
  qpdf_offset_t offset_00;
  size_type sVar3;
  reference this;
  QPDFObjectHandle local_158;
  QPDFObjectHandle local_148;
  undefined1 local_138 [8];
  QPDFObjectHandle item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  QPDFObjectHandle *local_c8;
  QPDFObjectHandle *oh;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  QPDFObjectHandle local_80;
  string local_70;
  undefined1 local_50 [8];
  pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  qpdf_offset_t offset;
  vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *result_local;
  QPDFObjectHandle *obj_local;
  size_t stream_number_local;
  
  offset_00 = QPDFObjectHandle::getParsedOffset();
  p.second.field_2._8_8_ = offset_00;
  QPDFObjectHandle::QPDFObjectHandle(&local_80,obj);
  make_objdesc_abi_cxx11_(&local_70,offset_00,&local_80);
  std::make_pair<long_long&,std::__cxx11::string>
            ((pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_50,(longlong *)(p.second.field_2._M_local_buf + 8),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  QPDFObjectHandle::~QPDFObjectHandle(&local_80);
  sVar3 = std::
          vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::size(result);
  if (sVar3 < stream_number + 1) {
    std::
    vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::resize(result,stream_number + 1);
  }
  this = std::
         vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         ::operator[](result,stream_number);
  std::
  vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(this,(value_type *)local_50);
  bVar1 = QPDFObjectHandle::isArray();
  if ((bVar1 & 1) == 0) {
    bVar1 = QPDFObjectHandle::isDictionary();
    if ((bVar1 & 1) == 0) {
      bVar1 = QPDFObjectHandle::isStream();
      if ((bVar1 & 1) != 0) {
        QPDFObjectHandle::getDict();
        walk(stream_number,&local_158,result);
        QPDFObjectHandle::~QPDFObjectHandle(&local_158);
      }
    }
    else {
      QPDFObjectHandle::getKeys_abi_cxx11_();
      __end3 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin3);
      key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin3);
      while (bVar2 = std::operator!=(&__end3,(_Self *)&key), bVar2) {
        item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end3);
        QPDFObjectHandle::getKey((string *)local_138);
        bVar1 = QPDFObjectHandle::isIndirect();
        if ((bVar1 & 1) == 0) {
          QPDFObjectHandle::QPDFObjectHandle(&local_148,(QPDFObjectHandle *)local_138);
          walk(stream_number,&local_148,result);
          QPDFObjectHandle::~QPDFObjectHandle(&local_148);
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_138);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin3);
    }
  }
  else {
    QPDFObjectHandle::getArrayAsVector();
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    oh = (QPDFObjectHandle *)
         std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                   ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&oh), bVar2) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end2);
      bVar1 = QPDFObjectHandle::isIndirect();
      if ((bVar1 & 1) == 0) {
        QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range3,local_c8);
        walk(stream_number,(QPDFObjectHandle *)&__range3,result);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3);
      }
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
  }
  std::
  pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_50);
  return;
}

Assistant:

void
walk(
    size_t stream_number,
    QPDFObjectHandle obj,
    std::vector<std::vector<std::pair<qpdf_offset_t, std::string>>>& result)
{
    qpdf_offset_t offset = obj.getParsedOffset();
    std::pair<qpdf_offset_t, std::string> p = std::make_pair(offset, make_objdesc(offset, obj));

    if (result.size() < stream_number + 1) {
        result.resize(stream_number + 1);
    }
    result[stream_number].push_back(p);

    if (obj.isArray()) {
        for (auto& oh: obj.getArrayAsVector()) {
            if (!oh.isIndirect()) {
                // QPDF::GetAllObjects() enumerates all indirect objects.
                // So only the direct objects are recursed here.
                walk(stream_number, oh, result);
            }
        }
    } else if (obj.isDictionary()) {
        for (auto const& key: obj.getKeys()) {
            QPDFObjectHandle item = obj.getKey(key);
            if (!item.isIndirect()) {
                // QPDF::GetAllObjects() enumerates all indirect objects.
                // So only the direct objects are recursed here.
                walk(stream_number, item, result);
            }
        }
    } else if (obj.isStream()) {
        walk(stream_number, obj.getDict(), result);
    }
}